

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  uint uVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  long *plVar7;
  long lVar8;
  BYTE *pBVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  
  pBVar2 = (ms->window).base;
  uVar1 = ms->nextToUpdate;
  pBVar9 = pBVar2 + (ulong)uVar1 + 3;
  if (pBVar9 < (BYTE *)((long)end - 6U)) {
    pUVar3 = ms->hashTable;
    plVar7 = (long *)(pBVar2 + uVar1);
    cVar4 = (char)(ms->cParams).hashLog;
    bVar5 = 0x40 - cVar4;
    bVar6 = 0x20 - cVar4;
    iVar13 = uVar1 + 1;
    iVar10 = (ms->cParams).minMatch - 5;
    do {
      switch(iVar10) {
      case 0:
        lVar8 = -0x30e4432345000000;
        break;
      case 1:
        lVar8 = -0x30e4432340650000;
        break;
      case 2:
        lVar8 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar11 = *plVar7 * -0x30e44323485a9b9d;
        goto LAB_001c505d;
      default:
        uVar11 = (ulong)((uint)((int)*plVar7 * -0x61c8864f) >> (bVar6 & 0x1f));
        goto LAB_001c5062;
      }
      uVar11 = lVar8 * *plVar7;
LAB_001c505d:
      uVar11 = uVar11 >> (bVar5 & 0x3f);
LAB_001c5062:
      pUVar3[uVar11] = (int)plVar7 - (int)pBVar2;
      if (dtlm != ZSTD_dtlm_fast) {
        lVar8 = 0;
        do {
          switch(iVar10) {
          case 0:
            lVar12 = -0x30e4432345000000;
            break;
          case 1:
            lVar12 = -0x30e4432340650000;
            break;
          case 2:
            lVar12 = -0x30e44323405a9d00;
            break;
          case 3:
            uVar11 = *(long *)((long)plVar7 + lVar8 + 1) * -0x30e44323485a9b9d;
            goto LAB_001c50aa;
          default:
            uVar11 = (ulong)((uint)(*(int *)((long)plVar7 + lVar8 + 1) * -0x61c8864f) >>
                            (bVar6 & 0x1f));
            goto LAB_001c50af;
          }
          uVar11 = lVar12 * *(long *)((long)plVar7 + lVar8 + 1);
LAB_001c50aa:
          uVar11 = uVar11 >> (bVar5 & 0x3f);
LAB_001c50af:
          if (pUVar3[uVar11] == 0) {
            pUVar3[uVar11] = iVar13 + (int)lVar8;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
      }
      pBVar9 = pBVar9 + 3;
      iVar13 = iVar13 + 3;
      plVar7 = (long *)((long)plVar7 + 3);
    } while (pBVar9 < (BYTE *)((long)end - 6U));
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for ( ; ip + fastHashFillStep < iend + 2; ip += fastHashFillStep) {
        U32 const curr = (U32)(ip - base);
        size_t const hash0 = ZSTD_hashPtr(ip, hBits, mls);
        hashTable[hash0] = curr;
        if (dtlm == ZSTD_dtlm_fast) continue;
        /* Only load extra positions for ZSTD_dtlm_full */
        {   U32 p;
            for (p = 1; p < fastHashFillStep; ++p) {
                size_t const hash = ZSTD_hashPtr(ip + p, hBits, mls);
                if (hashTable[hash] == 0) {  /* not yet filled */
                    hashTable[hash] = curr + p;
    }   }   }   }
}